

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O0

void __thiscall CLI::Range::Range<unsigned_int>(Range *this,uint min,uint max)

{
  char *pcVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  anon_class_8_2_43e49337 *__f;
  ostream *poVar2;
  uint in_EDX;
  uint in_ESI;
  string *in_RDI;
  stringstream out;
  Validator *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  uint local_10;
  uint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  Validator::Validator(in_stack_fffffffffffffdf0);
  ::std::__cxx11::stringstream::stringstream(local_198);
  pcVar1 = detail::type_name<unsigned_int,_(CLI::detail::enabler)0>();
  this_00 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)::std::operator<<(local_188,pcVar1);
  __f = (anon_class_8_2_43e49337 *)::std::operator<<((ostream *)this_00," in [");
  poVar2 = (ostream *)::std::ostream::operator<<(__f,local_c);
  poVar2 = ::std::operator<<(poVar2," - ");
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,local_10);
  ::std::operator<<(poVar2,"]");
  ::std::__cxx11::stringstream::str();
  Validator::description
            ((Validator *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_RDI);
  ::std::__cxx11::string::~string(local_1c8);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=(this_00,__f);
  ::std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

Range(T min, T max) {
        std::stringstream out;
        out << detail::type_name<T>() << " in [" << min << " - " << max << "]";
        description(out.str());

        func_ = [min, max](std::string &input) {
            T val;
            bool converted = detail::lexical_cast(input, val);
            if((!converted) || (val < min || val > max))
                return std::string("Value ") + input + " not in range " + std::to_string(min) + " to " +
                       std::to_string(max);

            return std::string();
        };
    }